

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

void __thiscall QListModeViewBase::clear(QListModeViewBase *this)

{
  QList<int>::clear(&this->flowPositions);
  QList<int>::clear(&this->segmentPositions);
  QList<int>::clear(&this->segmentStartRows);
  QList<int>::clear(&this->segmentExtents);
  this->batchSavedPosition = 0;
  (this->super_QCommonListViewBase).batchStartRow = 0;
  (this->super_QCommonListViewBase).batchSavedDeltaSeg = 0;
  return;
}

Assistant:

void QListModeViewBase::clear()
{
    flowPositions.clear();
    segmentPositions.clear();
    segmentStartRows.clear();
    segmentExtents.clear();
    batchSavedPosition = 0;
    batchStartRow = 0;
    batchSavedDeltaSeg = 0;
}